

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O3

void __thiscall bsplib::Rdma::PushPopCommBuf::execute(PushPopCommBuf *this,Rdma *rdma)

{
  undefined8 *puVar1;
  uint uVar2;
  pointer pPVar3;
  Memslot MVar4;
  pointer pMVar5;
  void *pvVar6;
  long *plVar7;
  iterator __position;
  pointer puVar8;
  _Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  __it;
  long *plVar9;
  exception *peVar10;
  ulong uVar11;
  Memslot *pMVar12;
  long *plVar13;
  long lVar14;
  ulong uVar15;
  uint *puVar16;
  long *plVar17;
  long lVar18;
  void *addr;
  unsigned_long local_210;
  ulong local_208;
  ulong local_200;
  _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1f8;
  PushPopCommBuf *local_1f0;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_1e8;
  long local_1e0;
  void *local_1d8;
  exception local_1d0;
  
  local_1e0 = (long)rdma->m_pid;
  uVar2 = rdma->m_nprocs;
  local_208 = (ulong)(int)uVar2;
  local_200 = (ulong)uVar2;
  pPVar3 = (this->m_pushed_slots).
           super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)(this->m_pushed_slots).
                 super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 5;
  local_1f0 = this;
  if (local_208 <= uVar11) {
    pMVar12 = &pPVar3->slot;
    uVar15 = 0;
    do {
      if (0 < (int)uVar2) {
        MVar4 = pPVar3[uVar15 * local_208].slot;
        puVar16 = (uint *)((long)&((rdma->m_used_slots).
                                   super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->status +
                          local_208 * 0x18 * MVar4);
        lVar18 = 0;
        do {
          if (*(Memslot *)((long)pMVar12 + lVar18) != MVar4) {
            peVar10 = (exception *)__cxa_allocate_exception(0x1a0);
            exception::exception(&local_1d0,"bsp_push_reg");
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1d0.m_stream,"Internal error; inconsistent slot id",0x24);
            exception::exception(peVar10,&local_1d0);
            __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
          }
          ((Memblock *)(puVar16 + 0xfffffffffffffffc))->addr =
               (void *)*(undefined8 *)((long)pMVar12 + lVar18 + -0x18);
          *(size_t *)(puVar16 + 0xfffffffffffffffe) = *(size_t *)((long)pMVar12 + lVar18 + -0x10);
          *(byte *)puVar16 = (byte)*puVar16 & 0xfe;
          lVar18 = lVar18 + 0x20;
          puVar16 = puVar16 + 6;
        } while (local_200 << 5 != lVar18);
      }
      uVar15 = uVar15 + 1;
      pMVar12 = pMVar12 + local_208 * 4;
    } while (uVar15 < uVar11 / local_208);
  }
  puVar8 = (this->m_popped_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_popped_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar8) {
    local_1f8 = &(rdma->m_register)._M_h;
    local_1e8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&rdma->m_free_slots;
    uVar11 = 0;
    do {
      local_210 = puVar8[uVar11];
      if (local_210 == 0xffffffffffffffff) {
        local_1d0.super_exception = (exception)0x0;
        local_1d0._1_7_ = 0;
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(local_1f8,(key_type *)&local_1d0);
        if (__it._M_cur == (__node_type *)0x0) {
          peVar10 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_1d0,"bsp_pop_reg");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1d0.m_stream,
                     "Tried to deregister NULL on all processes, but NULL was never registered",0x48
                    );
          exception::exception(peVar10,&local_1d0);
          __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
        }
        plVar9 = (long *)((long)__it._M_cur + 0x10);
        plVar7 = *(long **)((long)__it._M_cur + 0x10);
        plVar17 = plVar7;
        if (plVar7 != plVar9) {
          plVar13 = plVar7;
          while( true ) {
            local_210 = plVar13[2];
            plVar17 = plVar7;
            if ((int)local_200 < 1) break;
            lVar18 = 0;
            while (*(long *)((long)&(rdma->m_used_slots).
                                    super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [local_210 * (long)rdma->m_nprocs].addr + lVar18) == 0) {
              lVar18 = lVar18 + 0x18;
              plVar17 = plVar13;
              if ((ulong)uVar2 * 0x18 == lVar18) goto LAB_0010e2d6;
            }
            plVar13 = (long *)*plVar13;
            plVar17 = plVar13;
            if (plVar13 == plVar9) break;
          }
        }
LAB_0010e2d6:
        if (plVar17 == plVar9) {
          peVar10 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_1d0,"bsp_pop_reg");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1d0.m_stream,
                     "Tried to deregister NULL on all processes, but could not find a matching regisration (bsp_push_reg)"
                     ,99);
          exception::exception(peVar10,&local_1d0);
          __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
        }
      }
      else {
        lVar18 = local_210 * (long)rdma->m_nprocs;
        pMVar5 = (rdma->m_used_slots).
                 super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = pMVar5[lVar18 + local_1e0].addr;
        if ((pvVar6 != (void *)0x0) && ((pMVar5[lVar18 + local_1e0].status & 2) == 0)) {
          __assert_fail("rdma.slot(pid,id).addr == NULL || rdma.slot( pid, id ).status & Memblock::POPPED"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                        ,0x1fe,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
        }
        local_1d8 = pvVar6;
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(local_1f8,&local_1d8);
        if (__it._M_cur == (__node_type *)0x0) {
          __assert_fail("reg_entry != rdma.m_register.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                        ,0x201,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
        }
        lVar18 = (long)__it._M_cur + 0x10;
        do {
          lVar14 = lVar18;
          if (lVar14 == *(long *)((long)__it._M_cur + 0x10)) {
            peVar10 = (exception *)__cxa_allocate_exception(0x1a0);
            exception::exception(&local_1d0,"bsp_pop_reg");
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1d0.m_stream,"Internal error: inconsistent slot id",0x24);
            exception::exception(peVar10,&local_1d0);
            __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
          }
          lVar18 = *(long *)(lVar14 + 8);
        } while (*(unsigned_long *)(*(long *)(lVar14 + 8) + 0x10) != local_210);
        plVar17 = *(long **)(lVar14 + 8);
      }
      if (plVar17[2] != local_210) {
        __assert_fail("*rs == id",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                      ,0x22d,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
      }
      plVar7 = (long *)((long)&((__it._M_cur)->
                               super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_storage._M_storage + 0x18);
      *plVar7 = *plVar7 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(plVar17,0x18);
      if (*(undefined1 **)
           ((long)&((__it._M_cur)->
                   super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_storage._M_storage + 8) ==
          (undefined1 *)
          ((long)&((__it._M_cur)->
                  super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                  ).
                  super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_storage._M_storage + 8)) {
        std::
        _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(local_1f8,(const_iterator)__it._M_cur);
      }
      if (0 < (int)local_208) {
        lVar18 = (long)rdma->m_nprocs * local_210;
        pMVar5 = (rdma->m_used_slots).
                 super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pMVar5[lVar18].addr + lVar14);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&pMVar5[lVar18].status + lVar14) = 0;
          lVar14 = lVar14 + 0x18;
        } while ((ulong)uVar2 * 0x18 != lVar14);
      }
      __position._M_current =
           (rdma->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (rdma->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(local_1e8,__position,&local_210);
      }
      else {
        *__position._M_current = local_210;
        (rdma->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar11 = uVar11 + 1;
      puVar8 = (local_1f0->m_popped_slots).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(local_1f0->m_popped_slots).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3))
    ;
  }
  return;
}

Assistant:

void Rdma::PushPopCommBuf::execute( Rdma & rdma ) 
{
    const int pid = rdma.m_pid;
    const int nprocs = rdma.m_nprocs;
 
    /* do memory registrations */
    for (size_t s = 0; s < m_pushed_slots.size()/nprocs; ++s) {
        Memslot id = m_pushed_slots[s*nprocs].slot;

        for ( int p = 0 ; p < nprocs; ++p ) {
            if ( m_pushed_slots[ s*nprocs + p ].slot != id )
                throw exception("bsp_push_reg") << "Internal error; inconsistent slot id";

            rdma.slot( p, id ).addr = m_pushed_slots[ s*nprocs + p ].block.addr;
            rdma.slot( p, id ).size = m_pushed_slots[ s*nprocs + p ].block.size;
            rdma.slot( p, id ).status &= ~Memblock::PUSHED; 
        }
    }

    /* do memory deregistrations */
    for (size_t s = 0; s < m_popped_slots.size(); ++s) {
        Memslot id = m_popped_slots[s];

        Reg::iterator reg_entry;
        RegStack :: iterator rs; 

        if ( id != no_slot() ) {
            assert( rdma.slot(pid,id).addr == NULL
                   || rdma.slot( pid, id ).status & Memblock::POPPED );
            void * addr = rdma.slot( pid, id).addr;
            reg_entry = rdma.m_register.find( addr );
            assert( reg_entry != rdma.m_register.end() );
            RegStack & stack = reg_entry->second;
            RegStack :: reverse_iterator j ; 
            for (j = stack.rbegin(); j != stack.rend(); ++j )
                if ( *j == id ) break;

            if ( j == stack.rend() )
                throw exception("bsp_pop_reg") << "Internal error: inconsistent slot id";

            rs = j.base();
            --rs;
        }
        else
        { // then all processes have popped NULL
          // Let's delete the first full block of NULL we can encounter

            reg_entry = rdma.m_register.find( NULL );
            if( reg_entry == rdma.m_register.end() )
                throw exception("bsp_pop_reg") <<
                    "Tried to deregister NULL on all processes, but NULL was never registered";

            RegStack & stack = reg_entry->second;

            for ( rs = stack.begin(); rs != stack.end(); ++rs ) {

                id = *rs;

                bool all_nulls = true;
                for ( int p = 0; p < nprocs; ++p ) {
                    if ( rdma.slot( p, id ).addr != NULL ) {
                        all_nulls = false;
                        break;
                    }
                }

                if ( all_nulls ) {
                   break;
                }
            }
            if ( rs == stack.end() ) 
                throw exception("bsp_pop_reg") <<
                    "Tried to deregister NULL on all processes, but could not find a matching regisration (bsp_push_reg)";
        }

        assert( *rs == id );
        reg_entry->second.erase( rs );

        if ( reg_entry->second.empty())
            rdma.m_register.erase( reg_entry );

        for (int p = 0; p < nprocs; ++p) {
            rdma.slot( p, id ).addr = NULL;
            rdma.slot( p, id ).size = 0;
            rdma.slot( p, id ).status = Memblock::NORMAL;
        }
        rdma.m_free_slots.push_back( id );
    }
}